

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonEachCursorReset(JsonEachCursor *p)

{
  jsonParseReset(&p->sParse);
  jsonStringReset(&p->path);
  if (p->aParent != (JsonParent *)0x0) {
    sqlite3DbFreeNN(p->db,p->aParent);
  }
  p->iRowid = 0;
  p->i = 0;
  p->aParent = (JsonParent *)0x0;
  p->nParent = 0;
  p->nParentAlloc = 0;
  p->iEnd = 0;
  p->eType = '\0';
  return;
}

Assistant:

static void jsonEachCursorReset(JsonEachCursor *p){
  jsonParseReset(&p->sParse);
  jsonStringReset(&p->path);
  sqlite3DbFree(p->db, p->aParent);
  p->iRowid = 0;
  p->i = 0;
  p->aParent = 0;
  p->nParent = 0;
  p->nParentAlloc = 0;
  p->iEnd = 0;
  p->eType = 0;
}